

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_syst_inv.c
# Opt level: O1

_Bool test_syst_inv(int K_lower,int K_upper)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  void *__ptr;
  void *__ptr_00;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  size_t interProgSize;
  size_t interWorkSize;
  size_t interSymNum;
  uint local_4c;
  size_t local_48;
  size_t local_40;
  undefined1 local_38 [8];
  
  puts("Checking for invertibility from the K source symbols.");
  lVar7 = 0;
  local_4c = 0;
  do {
    uVar1 = *(uint *)((long)Kprime + lVar7);
    if (K_upper < (int)uVar1) break;
    bVar2 = false;
    if (K_lower <= (int)uVar1) {
      printf("--> Checking K=%d\n",(ulong)uVar1);
      uVar4 = RqInterGetMemSizes(uVar1,0,&local_40,&local_48,local_38);
      sVar3 = local_40;
      if ((int)uVar4 < 0) {
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,0x57,"RqInterGetMemSizes(K, 0, &interWorkSize, &interProgSize, &interSymNum)",
                (ulong)uVar4);
        bVar2 = true;
      }
      else {
        __ptr = malloc(local_40);
        uVar4 = RqInterInit(uVar1,0,__ptr,sVar3);
        if ((int)uVar4 < 0) {
          uVar5 = 0x59;
          pcVar6 = "RqInterInit(K, 0, interWork, interWorkSize)";
        }
        else {
          uVar4 = RqInterAddIds(__ptr,0,uVar1);
          sVar3 = local_48;
          if ((int)uVar4 < 0) {
            uVar5 = 0x5a;
            pcVar6 = "RqInterAddIds(interWork, 0, K)";
          }
          else {
            __ptr_00 = malloc(local_48);
            uVar4 = RqInterCompile(__ptr,__ptr_00,sVar3);
            if (-1 < (int)uVar4) {
              free(__ptr_00);
              free(__ptr);
              local_4c = local_4c + 1;
              bVar2 = false;
              goto LAB_001012f1;
            }
            uVar5 = 0x5c;
            pcVar6 = "RqInterCompile(interWork, interProg, interProgSize)";
          }
        }
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,uVar5,pcVar6,(ulong)uVar4);
        bVar2 = true;
      }
    }
LAB_001012f1:
    if (bVar2) {
      return false;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x774);
  printf("--> Passed, %d values were tested.\n",(ulong)local_4c);
  return true;
}

Assistant:

bool test_syst_inv(int K_lower, int K_upper)
{
	printf("Checking for invertibility from the K source symbols.\n");
	int ntest = 0;
	int i;
	for (i = 0; i < n_Kprime && Kprime[i] <= K_upper; ++i) {
		const int K = Kprime[i];
		if (K < K_lower)
			continue;
		printf("--> Checking K=%d\n", K);
		size_t interWorkSize, interProgSize, interSymNum;
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) < 0) { \
			fprintf(stderr, "Error:%s:%d: %s failed: %d.\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			return false; \
		} \
	} while(0)

		RUN_NOFAIL(RqInterGetMemSizes(K, 0,
		  &interWorkSize, &interProgSize, &interSymNum));
		RqInterWorkMem* interWork = malloc(interWorkSize);
		RUN_NOFAIL(RqInterInit(K, 0, interWork, interWorkSize));
		RUN_NOFAIL(RqInterAddIds(interWork, 0, K));
		RqInterProgram* interProg = malloc(interProgSize);
		RUN_NOFAIL(RqInterCompile(interWork, interProg, interProgSize));
#undef RUN_NOFAIL

		free(interProg);
		free(interWork);

		++ntest;
	}
	printf("--> Passed, %d values were tested.\n", ntest);
	return true;
}